

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

bool __thiscall FWallCoords::Init(FWallCoords *this,DVector2 *pt1,DVector2 *pt2,double too_close)

{
  short sVar1;
  short sVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  
  fVar6 = (float)(ViewSin * pt1->X - ViewCos * pt1->Y);
  fVar8 = (float)(ViewSin * pt2->X - ViewCos * pt2->Y);
  fVar3 = (float)(ViewTanSin * pt1->Y + ViewTanCos * pt1->X);
  fVar5 = (float)(ViewTanSin * pt2->Y + ViewTanCos * pt2->X);
  (this->tleft).X = fVar6;
  (this->tleft).Y = fVar3;
  (this->tright).X = fVar8;
  (this->tright).Y = fVar5;
  fVar4 = fVar5;
  if (((byte)MirrorFlags & 1) != 0) {
    fVar7 = -fVar6;
    fVar6 = -fVar8;
    (this->tleft).X = fVar6;
    (this->tleft).Y = fVar5;
    (this->tright).X = fVar7;
    (this->tright).Y = fVar3;
    fVar4 = fVar3;
    fVar3 = fVar5;
    fVar8 = fVar7;
  }
  if (-fVar3 <= fVar6) {
    if (fVar3 < fVar6) {
      return true;
    }
    if (fVar3 == 0.0) {
      return true;
    }
    dVar9 = (double)fVar3;
    sVar1 = SUB82(CenterX + 6755399441055744.0 + ((double)fVar6 * CenterX) / dVar9,0);
    this->sx1 = sVar1;
    this->sz1 = fVar3;
  }
  else {
    if (fVar8 < -fVar4) {
      return true;
    }
    fVar5 = (fVar6 + fVar3) - (fVar8 + fVar4);
    if (fVar5 == 0.0) {
      return true;
    }
    this->sx1 = 0;
    fVar5 = ((fVar4 - fVar3) * (fVar6 + fVar3)) / fVar5 + fVar3;
    this->sz1 = fVar5;
    dVar9 = (double)fVar5;
    sVar1 = 0;
  }
  sVar2 = (short)viewwidth;
  if (too_close <= dVar9) {
    if (fVar8 <= fVar4) {
      if (fVar8 < -fVar4) {
        return true;
      }
      if (fVar4 == 0.0) {
        return true;
      }
      dVar9 = (double)fVar4;
      sVar2 = SUB82(CenterX + 6755399441055744.0 + ((double)fVar8 * CenterX) / dVar9,0);
      this->sx2 = sVar2;
      this->sz2 = fVar4;
    }
    else {
      if (fVar3 < fVar6) {
        return true;
      }
      fVar8 = (fVar6 - (fVar3 + fVar8)) + fVar4;
      if (fVar8 == 0.0) {
        return true;
      }
      this->sx2 = (short)viewwidth;
      fVar3 = ((fVar6 - fVar3) * (fVar4 - fVar3)) / fVar8 + fVar3;
      this->sz2 = fVar3;
      dVar9 = (double)fVar3;
    }
    if (too_close <= dVar9) {
      return sVar2 <= sVar1;
    }
  }
  return true;
}

Assistant:

bool FWallCoords::Init(const DVector2 &pt1, const DVector2 &pt2, double too_close)
{
	tleft.X =  float(pt1.X * ViewSin - pt1.Y * ViewCos);
	tright.X = float(pt2.X * ViewSin - pt2.Y * ViewCos);

	tleft.Y =  float(pt1.X * ViewTanCos + pt1.Y * ViewTanSin);
	tright.Y = float(pt2.X * ViewTanCos + pt2.Y * ViewTanSin);

	if (MirrorFlags & RF_XFLIP)
	{
		float t = -tleft.X;
		tleft.X = -tright.X;
		tright.X = t;
		swapvalues(tleft.Y, tright.Y);
	}

	if (tleft.X >= -tleft.Y)
	{
		if (tleft.X > tleft.Y) return true;	// left edge is off the right side
		if (tleft.Y == 0) return true;
		sx1 = xs_RoundToInt(CenterX + tleft.X * CenterX / tleft.Y);
		sz1 = tleft.Y;
	}
	else
	{
		if (tright.X < -tright.Y) return true;	// wall is off the left side
		float den = tleft.X - tright.X - tright.Y + tleft.Y;
		if (den == 0) return true;
		sx1 = 0;
		sz1 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X + tleft.Y) / den;
	}

	if (sz1 < too_close)
		return true;

	if (tright.X <= tright.Y)
	{
		if (tright.X < -tright.Y) return true;	// right edge is off the left side
		if (tright.Y == 0) return true;
		sx2 = xs_RoundToInt(CenterX + tright.X * CenterX / tright.Y);
		sz2 = tright.Y;
	}
	else
	{
		if (tleft.X > tleft.Y) return true;	// wall is off the right side
		float den = tright.Y - tleft.Y - tright.X + tleft.X;
		if (den == 0) return true;
		sx2 = viewwidth;
		sz2 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X - tleft.Y) / den;
	}

	if (sz2 < too_close || sx2 <= sx1)
		return true;

	return false;
}